

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.hpp
# Opt level: O3

void bits::test_radixsort<unsigned_long,unsigned_int,8u>
               (_func_uint32_t_unsigned_long_ptr_unsigned_long_ptr_uint_ptr_uint_ptr_uint32_t
                *radixsort)

{
  long lVar1;
  result_type rVar2;
  ResultBuilder *pRVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  unsigned_long *rhs;
  uint32_t i;
  uint32_t out;
  uint32_t indices [2] [8];
  unsigned_long keys_copy [8];
  unsigned_long keys [2] [8];
  ResultBuilder __catchResult;
  type rng;
  uint32_t local_dd4;
  undefined1 local_dd0 [40];
  uint *local_da8;
  int local_d9c;
  uint local_d98 [8];
  uint local_d78 [8];
  result_type arStack_d58 [8];
  unsigned_long local_d18 [8];
  unsigned_long local_cd8 [8];
  ResultBuilder local_c98;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  local_9f8._M_x[0] = 0x1571;
  lVar1 = 1;
  uVar4 = 0x1571;
  do {
    uVar4 = (uVar4 >> 0x3e ^ uVar4) * 0x5851f42d4c957f2d + lVar1;
    local_9f8._M_x[lVar1] = uVar4;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x138);
  local_9f8._M_p = 0x138;
  lVar1 = 0;
  do {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(&local_9f8);
    local_d18[lVar1] = rVar2;
    arStack_d58[lVar1] = rVar2;
    local_d98[lVar1] = (uint)lVar1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  local_dd4 = (*radixsort)(local_d18,local_cd8,local_d98,local_d78,8);
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)local_dd0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bitshifter[P]radixsort/test/test_common.hpp"
             ,0x53);
  Catch::ResultBuilder::ResultBuilder
            (&local_c98,"REQUIRE",(SourceLineInfo *)local_dd0,"out < 2",Normal,"");
  if ((undefined1 *)local_dd0._0_8_ != local_dd0 + 0x10) {
    operator_delete((void *)local_dd0._0_8_,local_dd0._16_8_ + 1);
  }
  local_dd0._8_8_ = &local_dd4;
  local_d9c = 2;
  local_dd0._0_8_ = &local_c98;
  pRVar3 = Catch::ExpressionLhs<unsigned_int_const&>::
           captureExpression<(Catch::Internal::Operator)2,int>
                     ((ExpressionLhs<unsigned_int_const&> *)local_dd0,&local_d9c);
  Catch::ResultBuilder::endExpression(pRVar3);
  Catch::ResultBuilder::shouldDebugBreak(&local_c98);
  Catch::ResultBuilder::react(&local_c98);
  Catch::ResultBuilder::~ResultBuilder(&local_c98);
  local_da8 = local_d98 + (ulong)local_dd4 * 8;
  lVar1 = 1;
  puVar5 = local_d18 + (ulong)local_dd4 * 8;
  do {
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)local_dd0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bitshifter[P]radixsort/test/test_common.hpp"
               ,0x5a);
    Catch::ResultBuilder::ResultBuilder
              (&local_c98,"REQUIRE",(SourceLineInfo *)local_dd0,"keys_out[i - 1] <= keys_out[i]",
               Normal,"");
    if ((ResultBuilder *)local_dd0._0_8_ != (ResultBuilder *)(local_dd0 + 0x10)) {
      operator_delete((void *)local_dd0._0_8_,local_dd0._16_8_ + 1);
    }
    rhs = puVar5 + 1;
    local_dd0._0_8_ = &local_c98;
    local_dd0._8_8_ = puVar5;
    pRVar3 = Catch::ExpressionLhs<unsigned_long_const&>::
             captureExpression<(Catch::Internal::Operator)4,unsigned_long>
                       ((ExpressionLhs<unsigned_long_const&> *)local_dd0,rhs);
    Catch::ResultBuilder::endExpression(pRVar3);
    Catch::ResultBuilder::shouldDebugBreak(&local_c98);
    Catch::ResultBuilder::react(&local_c98);
    Catch::ResultBuilder::~ResultBuilder(&local_c98);
    Catch::SourceLineInfo::SourceLineInfo
              ((SourceLineInfo *)local_dd0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bitshifter[P]radixsort/test/test_common.hpp"
               ,0x5b);
    Catch::ResultBuilder::ResultBuilder
              (&local_c98,"REQUIRE",(SourceLineInfo *)local_dd0,
               "keys_out[i] == keys_copy[indices_out[i]]",Normal,"");
    if ((ResultBuilder *)local_dd0._0_8_ != (ResultBuilder *)(local_dd0 + 0x10)) {
      operator_delete((void *)local_dd0._0_8_,local_dd0._16_8_ + 1);
    }
    local_dd0._0_8_ = &local_c98;
    local_dd0._8_8_ = rhs;
    pRVar3 = Catch::ExpressionLhs<unsigned_long_const&>::
             captureExpression<(Catch::Internal::Operator)0,unsigned_long>
                       ((ExpressionLhs<unsigned_long_const&> *)local_dd0,
                        arStack_d58 + local_da8[lVar1]);
    Catch::ResultBuilder::endExpression(pRVar3);
    Catch::ResultBuilder::shouldDebugBreak(&local_c98);
    Catch::ResultBuilder::react(&local_c98);
    Catch::ResultBuilder::~ResultBuilder(&local_c98);
    lVar1 = lVar1 + 1;
    puVar5 = rhs;
  } while (lVar1 != 8);
  return;
}

Assistant:

void test_radixsort(uint32_t (*radixsort)(KeyType*, KeyType*, ValueType*, ValueType*, uint32_t))
{
    static const size_t array_size = N;
    typename RngType<KeyType>::type rng;
    KeyType keys[2][array_size];
    KeyType keys_copy[array_size];
    uint32_t indices[2][array_size];

    rand_keys(rng, keys[0], indices[0], keys_copy, array_size);
    auto out = radixsort(keys[0], keys[1], indices[0], indices[1], array_size);

    REQUIRE(out < 2);

    const KeyType* keys_out = keys[out];
    const uint32_t* indices_out = indices[out];

    for (uint32_t i = 1; i < array_size; ++i)
    {
        REQUIRE(keys_out[i - 1] <= keys_out[i]);
        REQUIRE(keys_out[i] == keys_copy[indices_out[i]]);
    }
}